

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearModel.cpp
# Opt level: O3

Result * __thiscall
CoreML::LinearModel::setOffsets
          (Result *__return_storage_ptr__,LinearModel *this,
          vector<double,_std::allocator<double>_> *offsets)

{
  double dVar1;
  Model *this_00;
  double *pdVar2;
  GLMRegressor *this_01;
  long lVar3;
  int iVar4;
  double *pdVar5;
  
  this_00 = (this->super_Model).m_spec.
            super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00->_oneof_case_[0] == 300) {
    this_01 = (this_00->Type_).glmregressor_;
  }
  else {
    Specification::Model::clear_Type(this_00);
    this_00->_oneof_case_[0] = 300;
    this_01 = (GLMRegressor *)operator_new(0x48);
    Specification::GLMRegressor::GLMRegressor(this_01);
    (this_00->Type_).glmregressor_ = this_01;
  }
  pdVar5 = (offsets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (offsets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar5 != pdVar2) {
    iVar4 = (this_01->offset_).current_size_;
    do {
      dVar1 = *pdVar5;
      if (iVar4 == (this_01->offset_).total_size_) {
        google::protobuf::RepeatedField<double>::Reserve(&this_01->offset_,iVar4 + 1);
        iVar4 = (this_01->offset_).current_size_;
      }
      lVar3 = (long)iVar4;
      iVar4 = iVar4 + 1;
      (this_01->offset_).current_size_ = iVar4;
      ((this_01->offset_).rep_)->elements[lVar3] = dVar1;
      pdVar5 = pdVar5 + 1;
    } while (pdVar5 != pdVar2);
  }
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result LinearModel::setOffsets(std::vector<double> offsets) {
        auto lr = m_spec->mutable_glmregressor();
        for(double n : offsets) {
            lr->add_offset(n);
        }
        return Result();
    }